

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBlit.h
# Opt level: O3

void irr::executeBlit_TextureCopy_24_to_16(SBlitJob *job)

{
  float fVar1;
  float fVar2;
  u32 uVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  ulong uVar7;
  void *pvVar8;
  ulong uVar9;
  byte *pbVar10;
  uint uVar11;
  u32 uVar12;
  uint uVar13;
  ulong uVar14;
  byte *pbVar15;
  
  uVar7 = (ulong)job->width;
  uVar3 = job->height;
  pvVar8 = job->dst;
  if (job->stretch == true) {
    if (uVar3 != 0) {
      fVar1 = (float)job->x_stretch;
      fVar2 = (float)job->y_stretch;
      pvVar6 = job->src;
      iVar4 = job->srcPitch;
      uVar5 = job->dstPitch;
      uVar11 = 0;
      do {
        if (uVar7 != 0) {
          uVar13 = (int)(long)((float)uVar11 * fVar2) * iVar4;
          uVar14 = 0;
          do {
            uVar9 = (long)((float)(uVar14 & 0xffffffff) * fVar1 * 3.0) & 0xffffffff;
            *(ushort *)((long)pvVar8 + uVar14 * 2) =
                 (ushort)(*(byte *)((long)pvVar6 + uVar9 + (ulong)uVar13 + 2) >> 3) +
                 (*(byte *)((long)pvVar6 + uVar9 + uVar13) & 0xf8) * 0x80 +
                 (*(byte *)((long)pvVar6 + uVar9 + (ulong)uVar13 + 1) & 0xf8) * 4 + -0x8000;
            uVar14 = uVar14 + 1;
          } while (uVar7 != uVar14);
        }
        pvVar8 = (void *)((long)pvVar8 + (ulong)uVar5);
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar3);
    }
  }
  else if (uVar3 != 0) {
    pbVar10 = (byte *)job->src;
    iVar4 = job->srcPitch;
    uVar5 = job->dstPitch;
    uVar12 = 0;
    do {
      if (uVar7 != 0) {
        uVar14 = 0;
        pbVar15 = pbVar10;
        do {
          *(ushort *)((long)pvVar8 + uVar14 * 2) =
               (*pbVar15 & 0xf8) * 0x80 + (pbVar15[1] & 0xf8) * 4 + (ushort)(pbVar15[2] >> 3) +
               -0x8000;
          pbVar15 = pbVar15 + 3;
          uVar14 = uVar14 + 1;
        } while (uVar7 != uVar14);
      }
      pbVar10 = pbVar10 + iVar4;
      pvVar8 = (void *)((long)pvVar8 + (ulong)uVar5);
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar3);
  }
  return;
}

Assistant:

static void executeBlit_TextureCopy_24_to_16(const SBlitJob *job)
{
	const u32 w = job->width;
	const u32 h = job->height;
	const u8 *src = static_cast<const u8 *>(job->src);
	u16 *dst = static_cast<u16 *>(job->dst);

	if (job->stretch) {
		const float wscale = job->x_stretch * 3.f;
		const float hscale = job->y_stretch;

		for (u32 dy = 0; dy < h; ++dy) {
			const u32 src_y = (u32)(dy * hscale);
			src = (u8 *)(job->src) + job->srcPitch * src_y;

			for (u32 dx = 0; dx < w; ++dx) {
				const u8 *src_x = src + (u32)(dx * wscale);
				dst[dx] = video::RGBA16(src_x[0], src_x[1], src_x[2]);
			}
			dst = (u16 *)((u8 *)(dst) + job->dstPitch);
		}
	} else {
		for (u32 dy = 0; dy != h; ++dy) {
			const u8 *s = src;
			for (u32 dx = 0; dx != w; ++dx) {
				dst[dx] = video::RGBA16(s[0], s[1], s[2]);
				s += 3;
			}

			src = src + job->srcPitch;
			dst = (u16 *)((u8 *)(dst) + job->dstPitch);
		}
	}
}